

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prop_down.h
# Opt level: O2

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::PropagateResult<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>
          (ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *con,Context ctx)

{
  Context ctx_00;
  double ub;
  Context local_1c;
  
  local_1c.value_ = ctx.value_;
  ctx_00 = Context::operator-(&local_1c);
  if (local_1c.value_ == CTX_ROOT) {
    ub = (con->super_AlgConRhs<_1>).rhs_;
  }
  else {
    ub = INFINITY;
  }
  ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::PropagateResult2QuadAndLinTerms
            ((ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)this,&con->super_QuadAndLinTerms,-INFINITY,ub,ctx_00);
  return;
}

Assistant:

void PropagateResult(const AlgebraicConstraint< Body, RngOrRhs >& con,
                       Context ctx) {
    /// Distinguish bounds' finiteness for context
    auto ctx_new = con.lb()<=MPCD( PracticallyMinusInf() )
                   ? -ctx : (con.ub()>=MPCD( PracticallyInf() )
                          ? +ctx : Context::CTX_MIX);
    auto LB = MPCD( MinusInfty() );
    auto UB = MPCD( Infty() );
    if (ctx.IsRoot()) {             // not for conditional comparisons
      LB = con.lb();
      UB = con.ub();
    }
    PropagateResult2Args(con.GetBody(), LB, UB, ctx_new);
  }